

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O1

adaptive_huffman_data_model * __thiscall
crnlib::adaptive_huffman_data_model::operator=
          (adaptive_huffman_data_model *this,adaptive_huffman_data_model *rhs)

{
  vector<unsigned_short> *pvVar1;
  vector<unsigned_char> *this_00;
  decoder_tables *other;
  uint32 *puVar2;
  uint16 *puVar3;
  decoder_tables *pdVar4;
  
  if (this != rhs) {
    this->m_total_syms = rhs->m_total_syms;
    this->m_update_cycle = rhs->m_update_cycle;
    this->m_symbols_until_update = rhs->m_symbols_until_update;
    this->m_total_count = rhs->m_total_count;
    if ((this->m_sym_freq).m_capacity < (rhs->m_sym_freq).m_size) {
      pvVar1 = &this->m_sym_freq;
      if (pvVar1->m_p != (unsigned_short *)0x0) {
        crnlib_free(pvVar1->m_p);
        pvVar1->m_p = (unsigned_short *)0x0;
        (this->m_sym_freq).m_size = 0;
        (this->m_sym_freq).m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)pvVar1,(rhs->m_sym_freq).m_size,false,2,(object_mover)0x0,false
                );
    }
    else if ((this->m_sym_freq).m_size != 0) {
      (this->m_sym_freq).m_size = 0;
    }
    memcpy((this->m_sym_freq).m_p,(rhs->m_sym_freq).m_p,(ulong)(rhs->m_sym_freq).m_size * 2);
    (this->m_sym_freq).m_size = (rhs->m_sym_freq).m_size;
    if (this != rhs) {
      if ((this->m_codes).m_capacity < (rhs->m_codes).m_size) {
        pvVar1 = &this->m_codes;
        if (pvVar1->m_p != (unsigned_short *)0x0) {
          crnlib_free(pvVar1->m_p);
          pvVar1->m_p = (unsigned_short *)0x0;
          (this->m_codes).m_size = 0;
          (this->m_codes).m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar1,(rhs->m_codes).m_size,false,2,(object_mover)0x0,false)
        ;
      }
      else if ((this->m_codes).m_size != 0) {
        (this->m_codes).m_size = 0;
      }
      memcpy((this->m_codes).m_p,(rhs->m_codes).m_p,(ulong)(rhs->m_codes).m_size * 2);
      (this->m_codes).m_size = (rhs->m_codes).m_size;
    }
    if (this != rhs) {
      if ((this->m_code_sizes).m_capacity < (rhs->m_code_sizes).m_size) {
        this_00 = &this->m_code_sizes;
        if (this_00->m_p != (uchar *)0x0) {
          crnlib_free(this_00->m_p);
          this_00->m_p = (uchar *)0x0;
          (this->m_code_sizes).m_size = 0;
          (this->m_code_sizes).m_capacity = 0;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,(rhs->m_code_sizes).m_size,false,1,(object_mover)0x0,
                   false);
      }
      else if ((this->m_code_sizes).m_size != 0) {
        (this->m_code_sizes).m_size = 0;
      }
      memcpy((this->m_code_sizes).m_p,(rhs->m_code_sizes).m_p,(ulong)(rhs->m_code_sizes).m_size);
      (this->m_code_sizes).m_size = (rhs->m_code_sizes).m_size;
    }
    other = rhs->m_pDecode_tables;
    pdVar4 = this->m_pDecode_tables;
    if (other == (decoder_tables *)0x0) {
      if (pdVar4 != (decoder_tables *)0x0) {
        puVar2 = pdVar4->m_lookup;
        if ((puVar2 != (uint32 *)0x0) && ((puVar2[-2] ^ puVar2[-1]) == 0xffffffff)) {
          crnlib_free(puVar2 + -4);
        }
        puVar3 = pdVar4->m_sorted_symbol_order;
        if ((puVar3 != (uint16 *)0x0) &&
           ((*(uint *)(puVar3 + -4) ^ *(uint *)(puVar3 + -2)) == 0xffffffff)) {
          crnlib_free(puVar3 + -8);
        }
        crnlib_free(pdVar4);
      }
      this->m_pDecode_tables = (decoder_tables *)0x0;
    }
    else if (pdVar4 == (decoder_tables *)0x0) {
      pdVar4 = (decoder_tables *)crnlib_malloc(0xc0);
      pdVar4->m_table_shift = 0;
      pdVar4->m_table_max_code = 0;
      pdVar4->m_decode_start_code_size = 0;
      pdVar4->m_sorted_symbol_order = (uint16 *)0x0;
      *(undefined8 *)&pdVar4->m_cur_lookup_size = 0;
      *(undefined8 *)((long)&pdVar4->m_lookup + 4) = 0;
      prefix_coding::decoder_tables::operator=(pdVar4,other);
      this->m_pDecode_tables = pdVar4;
    }
    else {
      prefix_coding::decoder_tables::operator=(pdVar4,other);
    }
    this->m_decoder_table_bits = rhs->m_decoder_table_bits;
    this->m_encoding = rhs->m_encoding;
  }
  return this;
}

Assistant:

adaptive_huffman_data_model& adaptive_huffman_data_model::operator=(const adaptive_huffman_data_model& rhs)
    {
        if (this == &rhs)
        {
            return *this;
        }

        m_total_syms = rhs.m_total_syms;

        m_update_cycle = rhs.m_update_cycle;
        m_symbols_until_update = rhs.m_symbols_until_update;

        m_total_count = rhs.m_total_count;

        m_sym_freq = rhs.m_sym_freq;

        m_codes = rhs.m_codes;
        m_code_sizes = rhs.m_code_sizes;

        if (rhs.m_pDecode_tables)
        {
            if (m_pDecode_tables)
            {
                *m_pDecode_tables = *rhs.m_pDecode_tables;
            }
            else
            {
                m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>(*rhs.m_pDecode_tables);
            }
        }
        else
        {
            crnlib_delete(m_pDecode_tables);
            m_pDecode_tables = nullptr;
        }

        m_decoder_table_bits = rhs.m_decoder_table_bits;
        m_encoding = rhs.m_encoding;

        return *this;
    }